

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findfunction.cpp
# Opt level: O0

int node_width(string *name_node,datanode *node,string *type_name)

{
  code *pcVar1;
  __type _Var2;
  bool bVar3;
  string *this;
  string name_node_1;
  int local_28;
  int i;
  int l;
  string *type_name_local;
  datanode *node_local;
  string *name_node_local;
  
  for (local_28 = 0; local_28 < nodepointer; local_28 = local_28 + 1) {
    _Var2 = std::operator==(&node[local_28].name,name_node);
    if (_Var2) {
      return node[local_28].width;
    }
  }
  bVar3 = std::operator!=(name_node,"gtn");
  if ((((bVar3) && (bVar3 = std::operator!=(name_node,"ltn"), bVar3)) &&
      (bVar3 = std::operator!=(name_node,"eqt"), bVar3)) &&
     (((bVar3 = std::operator!=(name_node,"Clk"), bVar3 &&
       (bVar3 = std::operator!=(name_node,"Rst"), bVar3)) &&
      (bVar3 = std::operator!=(name_node,"1"), bVar3)))) {
    this = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string(this,(string *)name_node);
    __cxa_throw(this,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int node_width(string name_node, struct datanode *node, string type_name)	//tyoe_namme is passed to just output it in case of error
 {
	 int l = 0;
		 for (int i = 0; i < nodepointer; i++)
		 {
			 if (node[i].name == name_node)
			 {
				 return node[i].width;
			 }
		 }
		 
		 if (name_node != "gtn" && name_node !="ltn" && name_node!="eqt" && name_node != "Clk" && name_node!="Rst" && name_node !="1") {
			 try {
				 throw (name_node);
			 }
			 catch (string name_node) {
				 cout << " Node : "<<name_node<<" Not Declared of type "<<type_name;
			 }
		 }
		  
		
 }